

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Value(char *prefix,float v,char *float_format)

{
  char fmt [64];
  
  if (float_format != (char *)0x0) {
    ImFormatString(fmt,0x40,"%%s: %s",float_format);
    Text(fmt,(double)v,prefix);
    return;
  }
  Text("%s: %.3f",(double)v,prefix);
  return;
}

Assistant:

void ImGui::Value(const char* prefix, float v, const char* float_format)
{
    if (float_format)
    {
        char fmt[64];
        ImFormatString(fmt, IM_ARRAYSIZE(fmt), "%%s: %s", float_format);
        Text(fmt, prefix, v);
    }
    else
    {
        Text("%s: %.3f", prefix, v);
    }
}